

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# String.cpp
# Opt level: O1

void __thiscall asl::String::split(String *this,Array<asl::String> *a)

{
  byte bVar1;
  long lVar2;
  int iVar3;
  int i;
  long lVar4;
  int iVar5;
  anon_union_16_2_78e7fdac_for_String_2 *paVar6;
  String local_48;
  
  Array<asl::String>::resize(a,0);
  if (this->_size == 0) {
    paVar6 = &this->field_2;
  }
  else {
    paVar6 = (anon_union_16_2_78e7fdac_for_String_2 *)(this->field_2)._str;
  }
  iVar3 = this->_len;
  if (-1 < iVar3) {
    i = 0;
    do {
      lVar2 = (long)i;
      bVar1 = paVar6->_space[lVar2];
      iVar5 = i;
      if ((((' ' < (char)bVar1) || (0x20 < bVar1)) ||
          ((0x100002600U >> ((ulong)(uint)bVar1 & 0x3f) & 1) == 0)) && (i < iVar3)) {
        lVar4 = 0;
        do {
          bVar1 = paVar6->_space[lVar4 + lVar2 + 1];
          if ((((char)bVar1 < '!') && (bVar1 < 0x21)) &&
             ((0x100002601U >> ((ulong)(uint)bVar1 & 0x3f) & 1) != 0)) {
            iVar5 = i + 1 + (int)lVar4;
            substring(&local_48,this,i,iVar5);
            Array<asl::String>::insert(a,-1,&local_48);
            if (local_48._size != 0) {
              ::free(local_48.field_2._str);
            }
            break;
          }
          lVar4 = lVar4 + 1;
        } while (iVar3 - lVar2 != lVar4);
      }
      i = iVar5 + 1;
      iVar3 = this->_len;
    } while (iVar5 < iVar3);
  }
  return;
}

Assistant:

void String::split(Array<String>& a) const
{
	a.clear();
	const char* s = str();
	for(int i=0; i<=length(); i++)
	{
		if(myisspace(s[i]))
			continue;
		for(int j=i+1; j<length()+1; j++)
		{
			if(myisspace(s[j]) || s[j]=='\0')
			{
				a << substring(i, j);
				i=j;
				break;
			}
		}
	}
}